

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

ReturnType * __thiscall
pbrt::ParameterDictionary::lookupSingle<(pbrt::ParameterType)9>
          (ReturnType *__return_storage_ptr__,ParameterDictionary *this,string *name,
          ReturnType *defaultValue)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar2;
  size_t sVar3;
  char *pcVar4;
  size_t __n;
  pointer pcVar5;
  long *plVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar10;
  char *fmt;
  
  paVar2 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar3 = (this->params).nStored;
  paVar10 = &(this->params).field_2;
  if (paVar2 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar10 = paVar2;
  }
  if (sVar3 != 0) {
    lVar9 = 0;
    do {
      pcVar4 = *(char **)((long)paVar10 + lVar9);
      __n = *(size_t *)(pcVar4 + 0x28);
      if ((__n == name->_M_string_length) &&
         (((__n == 0 ||
           (iVar8 = bcmp(*(void **)(pcVar4 + 0x20),(name->_M_dataplus)._M_p,__n), iVar8 == 0)) &&
          (iVar8 = std::__cxx11::string::compare(pcVar4), iVar8 == 0)))) {
        if (*(long *)(pcVar4 + 0x90) == 1) {
          pcVar4[0xb8] = '\x01';
          plVar6 = *(long **)(pcVar4 + 0x80);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          lVar9 = *plVar6;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,lVar9,plVar6[1] + lVar9);
          return __return_storage_ptr__;
        }
        if (*(long *)(pcVar4 + 0x90) == 0) {
          fmt = "No values provided for parameter \"%s\".";
        }
        else {
          fmt = "More than one value provided for parameter \"%s\".";
        }
        ErrorExit<std::__cxx11::string_const&>((FileLoc *)(pcVar4 + 0x40),fmt,name);
      }
      lVar9 = lVar9 + 8;
    } while (sVar3 << 3 != lVar9);
  }
  paVar1 = &defaultValue->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar5 = (defaultValue->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 == paVar1) {
    uVar7 = *(undefined8 *)((long)&defaultValue->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar7;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = defaultValue->_M_string_length;
  (defaultValue->_M_dataplus)._M_p = (pointer)paVar1;
  defaultValue->_M_string_length = 0;
  (defaultValue->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

typename ParameterTypeTraits<PT>::ReturnType ParameterDictionary::lookupSingle(
    const std::string &name,
    typename ParameterTypeTraits<PT>::ReturnType defaultValue) const {
    // Search _params_ for parameter _name_
    using traits = ParameterTypeTraits<PT>;
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != traits::typeName)
            continue;
        // Extract parameter values from _p_
        const auto &values = traits::GetValues(*p);

        // Issue error if incorrect number of parameter values were provided
        if (values.empty())
            ErrorExit(&p->loc, "No values provided for parameter \"%s\".", name);
        if (values.size() > traits::nPerItem)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);

        // Return parameter values as _ReturnType_
        p->lookedUp = true;
        return traits::Convert(values.data(), &p->loc);
    }

    return defaultValue;
}